

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberAccess.h
# Opt level: O2

void __thiscall
MemberAccess::MemberAccess(MemberAccess *this,ptr<Expression> *left,ptr<Expression> *right)

{
  ptr<Operation> local_48;
  ptr<Expression> local_38;
  ptr<Expression> local_28;
  
  local_48.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_48.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (left->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (left->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (left->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (left->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  local_38.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (right->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (right->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (right->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (right->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  BinaryOperator::BinaryOperator(&this->super_BinaryOperator,&local_48,&local_28,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_BinaryOperator).super_Expression._vptr_Expression =
       (_func_int **)&PTR_evaluate_001358b8;
  return;
}

Assistant:

MemberAccess(ptr<Expression> left, ptr<Expression> right) : BinaryOperator(nullptr, std::move(left), std::move(right)) { }